

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test::testBody
          (TEST_MockParameterTest_unmodifiedOutputParameterSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  char *pcVar5;
  char *pcVar6;
  int param;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  param = 1;
  SimpleString::SimpleString(&local_40,"");
  pMVar2 = mock(&local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_30,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var,iVar1),&local_30);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::SimpleString(&local_40,"");
  pMVar2 = mock(&local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_50);
  SimpleString::SimpleString(&local_30,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_30,&param);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  iVar1 = param;
  pUVar3 = UtestShell::getCurrent();
  if (iVar1 == 1) {
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x285,pTVar4);
  }
  else {
    ::StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    ::StringFrom((int)&local_50);
    pcVar6 = SimpleString::asCharString(&local_50);
    pTVar4 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x285,pTVar4);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  SimpleString::SimpleString(&local_40,"");
  pMVar2 = mock(&local_40,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

TEST(MockParameterTest, unmodifiedOutputParameterSucceeds)
{
    int param = 1;

    mock().expectOneCall("function").withUnmodifiedOutputParameter("parameterName");
    mock().actualCall("function").withOutputParameter("parameterName", &param);

    CHECK_EQUAL(param, 1);
    mock().checkExpectations();
}